

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies(llbuild::buildsystem::
BuildSystem&,llbuild::core::TaskInterface,llbuild::basic::QueueJobContext*,llvm::StringRef,llvm::
MemoryBuffer*,bool)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  undefined8 uVar1;
  raw_ostream *prVar2;
  BuildSystemDelegate *pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 local_88 [8];
  raw_string_ostream msgStream;
  string msg;
  uint64_t position_local;
  DepsActions *this_local;
  StringRef message_local;
  
  std::__cxx11::string::string((string *)&msgStream.OS);
  llvm::raw_string_ostream::raw_string_ostream
            ((raw_string_ostream *)local_88,(string *)&msgStream.OS);
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)local_88,"error reading dependency file \'")
  ;
  prVar2 = llvm::raw_ostream::operator<<(prVar2,*(StringRef *)((long)this + 0x28));
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"\': ");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,message);
  prVar2 = llvm::raw_ostream::operator<<(prVar2," at position ");
  llvm::raw_ostream::operator<<(prVar2,position);
  pBVar3 = BuildSystem::getDelegate(*(BuildSystem **)((long)this + 8));
  uVar1 = *(undefined8 *)((long)this + 0x20);
  llvm::raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_88);
  uVar4 = std::__cxx11::string::data();
  uVar5 = std::__cxx11::string::length();
  (*pBVar3->_vptr_BuildSystemDelegate[0xb])(pBVar3,uVar1,uVar4,uVar5);
  *(int *)((long)this + 0x38) = *(int *)((long)this + 0x38) + 1;
  llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_88);
  std::__cxx11::string::~string((string *)&msgStream.OS);
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
      std::string msg;
      raw_string_ostream msgStream(msg);
      msgStream << "error reading dependency file '" << depsPath << "': "
          << message << " at position " << position;
      system.getDelegate().commandHadError(command, msgStream.str());
      ++numErrors;
    }